

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

void __thiscall
Gecko::Graph::order(Graph *this,Functional *functional,uint iterations,uint window,uint period,
                   uint seed,Progress *progress)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  int iVar1;
  uint uVar2;
  uint k;
  uint k_00;
  Float FVar3;
  float local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> minperm;
  
  this->functional = functional;
  if (progress == (Progress *)0x0) {
    progress = (Progress *)operator_new(8);
    progress->_vptr_Progress = (_func_int **)&PTR__Progress_00114d48;
  }
  this->progress = progress;
  uVar2 = 0xffffffff;
  k_00 = 1;
  do {
    uVar2 = uVar2 + 1;
  } while ((uint)(1 << ((byte)uVar2 & 0x1f)) <
           (int)((ulong)((long)(this->node).
                               super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                        (long)(this->node).
                              super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 4) - 1U);
  this->level = uVar2;
  place(this,false);
  local_58 = cost(this);
  __x = &this->perm;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&minperm,__x);
  if (seed != 0) {
    shuffle(this,seed);
  }
  (*progress->_vptr_Progress[2])(local_58,progress,this);
  if ((((ulong)((long)(this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) >> 2) + 0x1ffffffff & 0x1fffffffe) !=
      0) {
    for (; k_00 <= iterations; k_00 = k_00 + 1) {
      iVar1 = (*progress->_vptr_Progress[8])(progress);
      if ((char)iVar1 != '\0') break;
      (*progress->_vptr_Progress[4])(progress,this,(ulong)k_00,(ulong)iterations,(ulong)window);
      reweight(this,k_00);
      vcycle(this,window,0);
      FVar3 = cost(this);
      if (FVar3 < local_58) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&minperm,__x);
        local_58 = FVar3;
      }
      (*progress->_vptr_Progress[5])(local_58,progress,this);
      if (period != 0) {
        window = window + (k_00 % period == 0);
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(__x,&minperm);
    place(this,false);
  }
  (*progress->_vptr_Progress[3])(local_58,progress,this);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&minperm.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void
Graph::order(Functional* functional, uint iterations, uint window, uint period, uint seed, Progress* progress)
{
  // Initialize graph.
  this->functional = functional;
  progress = this->progress = progress ? progress : new Progress;
  for (level = 0; (1u << level) < nodes(); level++);
  place();
  Float mincost = cost();
  vector<Node::Index> minperm = perm;
  if (seed)
    shuffle(seed);

  progress->beginorder(this, mincost);
  if (edges()) {
    // Perform specified number of V-cycles.
    for (uint k = 1; k <= iterations && !progress->quit(); k++) {
      progress->beginiter(this, k, iterations, window);
      reweight(k);
      vcycle(window);
      Float c = cost();
      if (c < mincost) { 
        mincost = c;
        minperm = perm;
      }
      progress->enditer(this, mincost, c);
      if (period && !(k % period))
        window++;
    }
    perm = minperm;
    place();
  }
  progress->endorder(this, mincost);

  if (!progress) {
    delete this->progress;
    this->progress = 0;
  }
}